

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_get_key_usage(uchar **p,uchar *end,uint *key_usage)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  mbedtls_x509_bitstring bs;
  mbedtls_asn1_bitstring local_28;
  
  local_28.len = 0;
  local_28.unused_bits = '\0';
  local_28._9_7_ = 0;
  local_28.p = (byte *)0x0;
  iVar1 = mbedtls_asn1_get_bitstring(p,end,&local_28);
  if (iVar1 == 0) {
    if (local_28.len == 0) {
      iVar1 = -0x2564;
    }
    else {
      *key_usage = 0;
      uVar3 = 4;
      if (local_28.len < 4) {
        uVar3 = local_28.len;
      }
      iVar1 = 0;
      uVar2 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 | (uint)*local_28.p << ((byte)uVar2 & 0x1f);
        *key_usage = uVar4;
        uVar2 = uVar2 + 8;
        local_28.p = local_28.p + 1;
      } while ((uint)((int)uVar3 << 3) != uVar2);
    }
  }
  else {
    iVar1 = iVar1 + -0x2500;
  }
  return iVar1;
}

Assistant:

static int x509_get_key_usage( unsigned char **p,
                               const unsigned char *end,
                               unsigned int *key_usage)
{
    int ret;
    size_t i;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if( ( ret = mbedtls_asn1_get_bitstring( p, end, &bs ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( bs.len < 1 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    /* Get actual bitstring */
    *key_usage = 0;
    for( i = 0; i < bs.len && i < sizeof( unsigned int ); i++ )
    {
        *key_usage |= (unsigned int) bs.p[i] << (8*i);
    }

    return( 0 );
}